

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

ASTObject * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,EndpointDeclaration *e)

{
  bool bVar1;
  EndpointDetails *pEVar2;
  pool_ref<soul::AST::Expression> *ppVar3;
  ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL> *this_00;
  PathSection *pPVar4;
  PathSection *p;
  PathSection *__end3_1;
  PathSection *__begin3_1;
  ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL> *__range3_1;
  pool_ref<soul::AST::Expression> *type;
  pool_ref<soul::AST::Expression> *__end3;
  pool_ref<soul::AST::Expression> *__begin3;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *__range3;
  EndpointDetails *details;
  EndpointDeclaration *e_local;
  RewritingASTVisitor *this_local;
  
  pEVar2 = pool_ptr<soul::AST::EndpointDetails>::get(&e->details);
  if (pEVar2 != (EndpointDetails *)0x0) {
    __end3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::begin
                       (&pEVar2->dataTypes);
    ppVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::end
                       (&pEVar2->dataTypes);
    for (; __end3 != ppVar3; __end3 = __end3 + 1) {
      replaceExpression(this,__end3);
    }
    replaceExpression(this,&pEVar2->arraySize);
  }
  bVar1 = pool_ptr<soul::AST::ChildEndpointPath>::operator!=(&e->childPath,(void *)0x0);
  if (bVar1) {
    this_00 = &pool_ptr<soul::AST::ChildEndpointPath>::operator->(&e->childPath)->sections;
    __end3_1 = ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL>::begin
                         (this_00);
    pPVar4 = ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL>::end(this_00);
    for (; __end3_1 != pPVar4; __end3_1 = __end3_1 + 1) {
      replaceExpression(this,&__end3_1->index);
    }
  }
  (*this->_vptr_RewritingASTVisitor[8])(this,&e->annotation);
  return &e->super_ASTObject;
}

Assistant:

virtual AST::ASTObject& visit (AST::EndpointDeclaration& e)
    {
        if (auto details = e.details.get())
        {
            for (auto& type : details->dataTypes)
                replaceExpression (type);

            replaceExpression (details->arraySize);
        }

        if (e.childPath != nullptr)
            for (auto& p : e.childPath->sections)
                replaceExpression (p.index);

        visit (e.annotation);
        return e;
    }